

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

bool __thiscall
slang::ast::Expression::requireLValue
          (Expression *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  Type *pTVar1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  Diagnostic *this_00;
  long lVar5;
  byte unaff_BPL;
  long lVar6;
  ConcatenationExpression *concat;
  
  switch(this->kind) {
  case NamedValue:
  case HierarchicalValue:
    bVar3 = ValueExpressionBase::requireLValueImpl
                      ((ValueExpressionBase *)this,context,location,flags,longestStaticPrefix);
    return bVar3;
  case UnaryOp:
  case BinaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Replication:
  case Call:
  case DataType:
  case TypeReference:
  case ArbitrarySymbol:
  case LValueReference:
    break;
  case Concatenation:
    bVar3 = Type::isIntegral((this->type).ptr);
    if (bVar3) {
      pTVar1 = this[1].type.ptr;
      unaff_BPL = pTVar1 == (Type *)0x0;
      if (!(bool)unaff_BPL) {
        puVar2 = *(undefined8 **)(this + 1);
        bVar4 = requireLValue((Expression *)*puVar2,context,location,
                              (bitmask<slang::ast::AssignFlags>)(flags.m_bits | 2),(Expression *)0x0
                             );
        if (bVar4) {
          lVar5 = 8;
          do {
            unaff_BPL = (long)pTVar1 << 3 == lVar5;
            if ((bool)unaff_BPL) break;
            bVar4 = requireLValue(*(Expression **)((long)puVar2 + lVar5),context,location,
                                  (bitmask<slang::ast::AssignFlags>)(flags.m_bits | 2),
                                  (Expression *)0x0);
            lVar5 = lVar5 + 8;
          } while (bVar4);
        }
      }
    }
    if (bVar3) goto LAB_00410c62;
    break;
  case Streaming:
    pTVar1 = this[1].type.ptr;
    if (pTVar1 == (Type *)0x0) {
      unaff_BPL = 1;
    }
    else {
      lVar5 = *(long *)(this + 1);
      lVar6 = 0;
      do {
        unaff_BPL = requireLValue(*(Expression **)(lVar5 + lVar6),context,location,
                                  (bitmask<slang::ast::AssignFlags>)(flags.m_bits | 2),
                                  longestStaticPrefix);
        if (!(bool)unaff_BPL) break;
        bVar3 = (long)pTVar1 * 0x18 + -0x18 != lVar6;
        lVar6 = lVar6 + 0x18;
      } while (bVar3);
    }
    goto LAB_00410c62;
  case ElementSelect:
    bVar3 = ElementSelectExpression::requireLValueImpl
                      ((ElementSelectExpression *)this,context,location,flags,longestStaticPrefix);
    return bVar3;
  case RangeSelect:
    bVar3 = RangeSelectExpression::requireLValueImpl
                      ((RangeSelectExpression *)this,context,location,flags,longestStaticPrefix);
    return bVar3;
  case MemberAccess:
    bVar3 = MemberAccessExpression::requireLValueImpl
                      ((MemberAccessExpression *)this,context,location,flags,longestStaticPrefix);
    return bVar3;
  case Conversion:
    if ((int)this[1].kind < 2) {
      unaff_BPL = requireLValue((Expression *)this[1].type.ptr,context,location,flags,
                                longestStaticPrefix);
      goto LAB_00410c62;
    }
    break;
  case SimpleAssignmentPattern:
    unaff_BPL = *(byte *)&this[1].constant;
    goto LAB_00410c62;
  default:
    if (this->kind != Invalid) break;
    goto LAB_00410c60;
  }
  if (((ulong)location & 0xfffffff) == 0) {
    location = (this->sourceRange).startLoc;
  }
  this_00 = ASTContext::addDiag(context,(DiagCode)0x560007,location);
  Diagnostic::operator<<(this_00,this->sourceRange);
LAB_00410c60:
  unaff_BPL = 0;
LAB_00410c62:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool Expression::requireLValue(const ASTContext& context, SourceLocation location,
                               bitmask<AssignFlags> flags,
                               const Expression* longestStaticPrefix) const {
    switch (kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue: {
            auto& ve = as<ValueExpressionBase>();
            return ve.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::ElementSelect: {
            auto& select = as<ElementSelectExpression>();
            return select.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::RangeSelect: {
            auto& select = as<RangeSelectExpression>();
            return select.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::MemberAccess: {
            auto& access = as<MemberAccessExpression>();
            return access.requireLValueImpl(context, location, flags, longestStaticPrefix);
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            if (!concat.type->isIntegral())
                break;

            SLANG_ASSERT(!longestStaticPrefix || flags.has(AssignFlags::SlicedPort));
            for (auto op : concat.operands()) {
                if (!op->requireLValue(context, location, flags | AssignFlags::InConcat)) {
                    return false;
                }
            }
            return true;
        }
        case ExpressionKind::SimpleAssignmentPattern:
            return as<SimpleAssignmentPatternExpression>().isLValue;
        case ExpressionKind::Streaming: {
            SLANG_ASSERT(!longestStaticPrefix);
            auto& stream = as<StreamingConcatenationExpression>();
            for (auto& op : stream.streams()) {
                if (!op.operand->requireLValue(context, location, flags | AssignFlags::InConcat,
                                               longestStaticPrefix)) {
                    return false;
                }
            }
            return true;
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            if (conv.isImplicit()) {
                return conv.operand().requireLValue(context, location, flags, longestStaticPrefix);
            }
            break;
        }
        case ExpressionKind::Invalid:
            return false;
        default:
            break;
    }

    if (!location)
        location = sourceRange.start();

    auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
    diag << sourceRange;
    return false;
}